

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

_Bool is_message_in_queue(MESSAGE_SENDER_HANDLE message_sender,ASYNC_OPERATION_HANDLE message)

{
  ulong local_28;
  size_t i;
  _Bool result;
  ASYNC_OPERATION_HANDLE message_local;
  MESSAGE_SENDER_HANDLE message_sender_local;
  
  local_28 = 0;
  while( true ) {
    if (message_sender->message_count <= local_28) {
      return false;
    }
    if (message_sender->messages[local_28] == message) break;
    local_28 = local_28 + 1;
  }
  return true;
}

Assistant:

static bool is_message_in_queue(MESSAGE_SENDER_HANDLE message_sender, ASYNC_OPERATION_HANDLE message)
{
    bool result = false;

    for (size_t i = 0; i < message_sender->message_count; i++)
    {
        if (message_sender->messages[i] == message)
        {
            result = true;
            break;
        }
    }

    return result;
}